

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O2

Status __thiscall leveldb::DBImpl::MakeRoomForWrite(DBImpl *this,bool force)

{
  VersionSet *pVVar1;
  uint64_t number;
  Env *pEVar2;
  _func_int **pp_Var3;
  WritableFile *dest;
  int iVar4;
  size_t sVar5;
  Writer *pWVar6;
  MemTable *this_00;
  byte in_DL;
  undefined7 in_register_00000031;
  DBImpl *this_01;
  byte bVar7;
  long in_FS_OFFSET;
  DB local_68;
  WritableFile *lfile;
  string local_58;
  long local_38;
  
  this_01 = (DBImpl *)CONCAT71(in_register_00000031,force);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this_01->writers_).
      super__Deque_base<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>.
      _M_impl.super__Deque_impl_data._M_finish._M_cur ==
      (this_01->writers_).
      super__Deque_base<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>.
      _M_impl.super__Deque_impl_data._M_start._M_cur) {
    __assert_fail("!writers_.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/db_impl.cc"
                  ,0x52b,"Status leveldb::DBImpl::MakeRoomForWrite(bool)");
  }
  (this->super_DB)._vptr_DB = (_func_int **)0x0;
  bVar7 = in_DL ^ 1;
LAB_00542de7:
  do {
    if ((this_01->bg_error_).state_ != (char *)0x0) {
      Status::operator=((Status *)this,&this_01->bg_error_);
LAB_00542fed:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return (Status)(char *)this;
      }
      __stack_chk_fail();
    }
    if ((bVar7 & 1) == 0) {
LAB_00542e0b:
      if ((in_DL & 1) == 0) {
        sVar5 = MemTable::ApproximateMemoryUsage(this_01->mem_);
        if (sVar5 <= (this_01->options_).write_buffer_size) goto LAB_00542fed;
      }
      if (this_01->imm_ == (MemTable *)0x0) {
        iVar4 = VersionSet::NumLevelFiles(this_01->versions_,0);
        if (iVar4 < 0xc) {
          pVVar1 = this_01->versions_;
          if (pVVar1->prev_log_number_ != 0) {
            __assert_fail("versions_->PrevLogNumber() == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/db_impl.cc"
                          ,0x54e,"Status leveldb::DBImpl::MakeRoomForWrite(bool)");
          }
          number = pVVar1->next_file_number_;
          pVVar1->next_file_number_ = number + 1;
          lfile = (WritableFile *)0x0;
          pEVar2 = this_01->env_;
          LogFileName(&local_58,&this_01->dbname_,number);
          (*pEVar2->_vptr_Env[4])(&local_68,pEVar2,&local_58,&lfile);
          pp_Var3 = (this->super_DB)._vptr_DB;
          (this->super_DB)._vptr_DB = local_68._vptr_DB;
          local_68._vptr_DB = pp_Var3;
          Status::~Status((Status *)&local_68);
          std::__cxx11::string::~string((string *)&local_58);
          if ((this->super_DB)._vptr_DB != (_func_int **)0x0) {
            if (this_01->versions_->next_file_number_ == number + 1) {
              this_01->versions_->next_file_number_ = number;
            }
            goto LAB_00542fed;
          }
          pWVar6 = this_01->log_;
          if (pWVar6 != (Writer *)0x0) {
            log::Writer::~Writer(pWVar6);
          }
          operator_delete(pWVar6,0x20);
          if (this_01->logfile_ != (WritableFile *)0x0) {
            (*this_01->logfile_->_vptr_WritableFile[1])();
          }
          dest = lfile;
          this_01->logfile_ = lfile;
          this_01->logfile_number_ = number;
          pWVar6 = (Writer *)operator_new(0x20);
          log::Writer::Writer(pWVar6,dest);
          this_01->log_ = pWVar6;
          this_01->imm_ = this_01->mem_;
          (this_01->has_imm_)._M_base._M_i = true;
          this_00 = (MemTable *)operator_new(0x70);
          MemTable::MemTable(this_00,&this_01->internal_comparator_);
          this_01->mem_ = this_00;
          this_00->refs_ = this_00->refs_ + 1;
          MaybeScheduleCompaction(this_01);
          in_DL = 0;
          goto LAB_00542de7;
        }
        Log((this_01->options_).info_log,"Too many L0 files; waiting...\n");
      }
      else {
        Log((this_01->options_).info_log,"Current memtable full; waiting...\n");
      }
      port::CondVar::Wait(&this_01->background_work_finished_signal_);
      goto LAB_00542de7;
    }
    iVar4 = VersionSet::NumLevelFiles(this_01->versions_,0);
    if (iVar4 < 8) goto LAB_00542e0b;
    pthread_mutex_unlock((pthread_mutex_t *)&this_01->mutex_);
    (*this_01->env_->_vptr_Env[0x14])();
    bVar7 = 0;
    std::mutex::lock(&(this_01->mutex_).mu_);
  } while( true );
}

Assistant:

Status DBImpl::MakeRoomForWrite(bool force) {
  mutex_.AssertHeld();
  assert(!writers_.empty());
  bool allow_delay = !force;
  Status s;
  while (true) {
    if (!bg_error_.ok()) {
      // Yield previous error
      s = bg_error_;
      break;
    } else if (allow_delay && versions_->NumLevelFiles(0) >=
                                  config::kL0_SlowdownWritesTrigger) {
      // We are getting close to hitting a hard limit on the number of
      // L0 files.  Rather than delaying a single write by several
      // seconds when we hit the hard limit, start delaying each
      // individual write by 1ms to reduce latency variance.  Also,
      // this delay hands over some CPU to the compaction thread in
      // case it is sharing the same core as the writer.
      mutex_.Unlock();
      env_->SleepForMicroseconds(1000);
      allow_delay = false;  // Do not delay a single write more than once
      mutex_.Lock();
    } else if (!force &&
               (mem_->ApproximateMemoryUsage() <= options_.write_buffer_size)) {
      // There is room in current memtable
      break;
    } else if (imm_ != nullptr) {
      // We have filled up the current memtable, but the previous
      // one is still being compacted, so we wait.
      Log(options_.info_log, "Current memtable full; waiting...\n");
      background_work_finished_signal_.Wait();
    } else if (versions_->NumLevelFiles(0) >= config::kL0_StopWritesTrigger) {
      // There are too many level-0 files.
      Log(options_.info_log, "Too many L0 files; waiting...\n");
      background_work_finished_signal_.Wait();
    } else {
      // Attempt to switch to a new memtable and trigger compaction of old
      assert(versions_->PrevLogNumber() == 0);
      uint64_t new_log_number = versions_->NewFileNumber();
      WritableFile* lfile = nullptr;
      s = env_->NewWritableFile(LogFileName(dbname_, new_log_number), &lfile);
      if (!s.ok()) {
        // Avoid chewing through file number space in a tight loop.
        versions_->ReuseFileNumber(new_log_number);
        break;
      }
      delete log_;
      delete logfile_;
      logfile_ = lfile;
      logfile_number_ = new_log_number;
      log_ = new log::Writer(lfile);
      imm_ = mem_;
      has_imm_.store(true, std::memory_order_release);
      mem_ = new MemTable(internal_comparator_);
      mem_->Ref();
      force = false;  // Do not force another compaction if have room
      MaybeScheduleCompaction();
    }
  }
  return s;
}